

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O3

Arities __thiscall wabt::ModuleContext::GetExprArity(ModuleContext *this,Expr *expr)

{
  iterator __position;
  Index IVar1;
  uint uVar2;
  Event *pEVar3;
  Func *pFVar4;
  undefined8 extraout_RAX;
  uint *__args_2;
  undefined4 uVar5;
  undefined4 extraout_EDX;
  undefined8 in_RDX;
  undefined7 uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  string *__args_1;
  ulong uVar7;
  Expr *__args;
  TypeVector *in_R8;
  ulong uVar8;
  CallIndirectExpr *ci_expr;
  Arities AVar9;
  Arities AVar10;
  Arities AVar11;
  undefined8 extraout_RAX_00;
  undefined4 extraout_EDX_00;
  
  uVar8 = 2;
  uVar7 = 1;
  __args_2 = &switchD_0015e28e::switchdataD_0017ca58;
  uVar6 = (undefined7)((ulong)in_RDX >> 8);
  __args = expr;
  switch(expr->type_) {
  case AtomicLoad:
  case BrOnExn:
  case Convert:
  case Load:
  case LocalTee:
  case MemoryGrow:
  case RefIsNull:
  case TableGet:
  case Unary:
    uVar7 = 1;
    uVar5 = 0;
    uVar8 = 1;
    goto LAB_0015e2d4;
  case AtomicRmw:
  case AtomicNotify:
  case Binary:
  case Compare:
  case SimdShuffleOp:
  case TableGrow:
    break;
  case AtomicRmwCmpxchg:
  case AtomicWait:
  case Select:
  case Ternary:
    uVar8 = 3;
    break;
  case AtomicStore:
  case Store:
  case TableSet:
    goto switchD_0015e28e_caseD_3;
  case Block:
  case Loop:
  case Try:
    uVar7 = (ulong)((long)expr[3].super_intrusive_list_base<wabt::Expr>.prev_ -
                   (long)expr[3].super_intrusive_list_base<wabt::Expr>.next_) >> 2;
    goto switchD_0015e28e_caseD_f;
  case Br:
    IVar1 = GetLabelArity(this,(Var *)(expr + 1));
    uVar8 = (ulong)IVar1;
    in_RDX = extraout_RDX;
    goto LAB_0015e482;
  case BrIf:
    IVar1 = GetLabelArity(this,(Var *)(expr + 1));
    uVar7 = (ulong)IVar1;
    uVar8 = (ulong)(IVar1 + 1);
    break;
  case BrTable:
    IVar1 = GetLabelArity(this,(Var *)&expr[1].loc);
    uVar8 = (ulong)(IVar1 + 1);
    in_RDX = extraout_RDX_00;
    goto LAB_0015e482;
  case Call:
    pFVar4 = Module::GetFunc(this->module,(Var *)(expr + 1));
    uVar7 = 0;
    uVar8 = 0;
    if (pFVar4 != (Func *)0x0) {
      uVar8 = (ulong)((long)(pFVar4->decl).sig.param_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pFVar4->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
    }
    pFVar4 = Module::GetFunc(this->module,(Var *)(expr + 1));
    if (pFVar4 != (Func *)0x0) {
      uVar7 = (long)(pFVar4->decl).sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pFVar4->decl).sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
      goto LAB_0015e3ae;
    }
    break;
  case CallIndirect:
    uVar8 = (ulong)((int)((ulong)((long)expr[2].loc.filename.data_ -
                                 (long)expr[2].super_intrusive_list_base<wabt::Expr>.prev_) >> 2) +
                   1);
    uVar7 = *(long *)((long)&expr[2].loc.field_1 + 8) - *(long *)&expr[2].loc.field_1;
LAB_0015e3ae:
    uVar7 = uVar7 >> 2;
    break;
  case Const:
  case GlobalGet:
  case LocalGet:
  case MemorySize:
  case RefFunc:
  case RefNull:
  case TableSize:
    goto switchD_0015e28e_caseD_f;
  case Drop:
  case GlobalSet:
  case LocalSet:
    uVar8 = 1;
    goto switchD_0015e28e_caseD_3;
  case If:
    uVar7 = (ulong)((long)expr[3].super_intrusive_list_base<wabt::Expr>.prev_ -
                   (long)expr[3].super_intrusive_list_base<wabt::Expr>.next_) >> 2;
    uVar8 = 1;
    break;
  case MemoryCopy:
  case MemoryFill:
  case MemoryInit:
  case TableCopy:
  case TableInit:
    uVar8 = 3;
switchD_0015e28e_caseD_3:
    uVar7 = 0;
    break;
  case DataDrop:
  case Nop:
  case ElemDrop:
    uVar7 = 0;
switchD_0015e28e_caseD_f:
    uVar8 = 0;
    break;
  case Rethrow:
    uVar5 = (undefined4)CONCAT71(uVar6,1);
    uVar7 = 0;
    goto LAB_0015e3e3;
  case Return:
    uVar8 = (ulong)((long)(this->current_func_->decl).sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->current_func_->decl).sig.result_types.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    goto LAB_0015e482;
  case ReturnCall:
    pFVar4 = Module::GetFunc(this->module,(Var *)(expr + 1));
    uVar7 = 0;
    uVar8 = 0;
    if (pFVar4 != (Func *)0x0) {
      uVar8 = (ulong)((long)(pFVar4->decl).sig.param_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pFVar4->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
    }
    pFVar4 = Module::GetFunc(this->module,(Var *)(expr + 1));
    uVar5 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),1);
    if (pFVar4 != (Func *)0x0) {
      uVar7 = (ulong)((long)(pFVar4->decl).sig.result_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pFVar4->decl).sig.result_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
    }
    goto LAB_0015e2d4;
  case ReturnCallIndirect:
    uVar8 = (ulong)((int)((ulong)((long)expr[2].loc.filename.data_ -
                                 (long)expr[2].super_intrusive_list_base<wabt::Expr>.prev_) >> 2) +
                   1);
    uVar7 = (ulong)(*(long *)((long)&expr[2].loc.field_1 + 8) - *(long *)&expr[2].loc.field_1) >> 2;
LAB_0015e482:
    uVar5 = (undefined4)CONCAT71((int7)((ulong)in_RDX >> 8),1);
    goto LAB_0015e2d4;
  case SimdLaneOp:
    uVar2 = *(int *)&expr->field_0x3c - 0xda;
    if ((0x12 < uVar2) || (__args_2 = (uint *)0x6db77, (0x6db77U >> (uVar2 & 0x1f) & 1) == 0)) {
      GetExprArity();
      goto switchD_0015e28e_caseD_2b;
    }
    uVar8 = (ulong)*(uint *)(&DAT_0017cb40 + (ulong)uVar2 * 4);
    break;
  default:
switchD_0015e28e_caseD_2b:
    GetExprArity();
    __position._M_current = (Label *)(expr->super_intrusive_list_base<wabt::Expr>).next_;
    if (__position._M_current != (Label *)(expr->super_intrusive_list_base<wabt::Expr>).prev_) {
      Label::Label(__position._M_current,*(LabelType *)&__args->_vptr_Expr,__args_1,
                   (TypeVector *)__args_2,in_R8);
      (expr->super_intrusive_list_base<wabt::Expr>).next_ =
           (Expr *)&(expr->super_intrusive_list_base<wabt::Expr>).next_[1].loc;
      AVar10._8_4_ = extraout_EDX;
      AVar10.nargs = (int)extraout_RAX;
      AVar10.nreturns = (int)((ulong)extraout_RAX >> 0x20);
      return AVar10;
    }
    std::vector<wabt::Label,std::allocator<wabt::Label>>::
    _M_realloc_insert<wabt::LabelType&,std::__cxx11::string_const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&>
              ((vector<wabt::Label,std::allocator<wabt::Label>> *)expr,__position,
               (LabelType *)__args,__args_1,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)__args_2,in_R8);
    AVar11._8_4_ = extraout_EDX_00;
    AVar11.nargs = (int)extraout_RAX_00;
    AVar11.nreturns = (int)((ulong)extraout_RAX_00 >> 0x20);
    return AVar11;
  case Throw:
    pEVar3 = Module::GetEvent(this->module,(Var *)(expr + 1));
    uVar5 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
    uVar7 = 0;
    if (pEVar3 != (Event *)0x0) {
      uVar8 = (ulong)((long)(pEVar3->decl).sig.param_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pEVar3->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      goto LAB_0015e2d4;
    }
    goto LAB_0015e3e3;
  case Last:
    uVar5 = (undefined4)CONCAT71(uVar6,1);
LAB_0015e3e3:
    uVar8 = 0;
    goto LAB_0015e2d4;
  }
  uVar5 = 0;
LAB_0015e2d4:
  AVar9._0_8_ = uVar8 & 0xffffffff | uVar7 << 0x20;
  AVar9._8_4_ = uVar5;
  return AVar9;
}

Assistant:

ModuleContext::Arities ModuleContext::GetExprArity(const Expr& expr) const {
  switch (expr.type()) {
    case ExprType::AtomicNotify:
    case ExprType::AtomicRmw:
    case ExprType::Binary:
    case ExprType::Compare:
    case ExprType::TableGrow:
      return { 2, 1 };

    case ExprType::AtomicStore:
    case ExprType::Store:
    case ExprType::TableSet:
      return { 2, 0 };

    case ExprType::Block:
      return { 0, cast<BlockExpr>(&expr)->block.decl.sig.GetNumResults() };

    case ExprType::Br:
      return { GetLabelArity(cast<BrExpr>(&expr)->var), 1, true };

    case ExprType::BrIf: {
      Index arity = GetLabelArity(cast<BrIfExpr>(&expr)->var);
      return { arity + 1, arity };
    }

    case ExprType::BrOnExn:
      return { 1, 1 };

    case ExprType::BrTable:
      return { GetLabelArity(cast<BrTableExpr>(&expr)->default_target) + 1, 1,
               true };

    case ExprType::Call: {
      const Var& var = cast<CallExpr>(&expr)->var;
      return { GetFuncParamCount(var), GetFuncResultCount(var) };
    }

    case ExprType::ReturnCall: {
      const Var& var = cast<ReturnCallExpr>(&expr)->var;
      return { GetFuncParamCount(var), GetFuncResultCount(var), true };
    }

    case ExprType::CallIndirect: {
      const auto* ci_expr = cast<CallIndirectExpr>(&expr);
      return { ci_expr->decl.GetNumParams() + 1,
               ci_expr->decl.GetNumResults() };
    }

    case ExprType::ReturnCallIndirect: {
      const auto* rci_expr = cast<ReturnCallIndirectExpr>(&expr);
      return { rci_expr->decl.GetNumParams() + 1,
               rci_expr->decl.GetNumResults(), true };
    }

    case ExprType::Const:
    case ExprType::GlobalGet:
    case ExprType::LocalGet:
    case ExprType::MemorySize:
    case ExprType::TableSize:
    case ExprType::RefNull:
    case ExprType::RefFunc:
      return { 0, 1 };

    case ExprType::Unreachable:
      return { 0, 1, true };

    case ExprType::DataDrop:
    case ExprType::ElemDrop:
      return { 0, 0 };

    case ExprType::MemoryInit:
    case ExprType::TableInit:
    case ExprType::MemoryFill:
    case ExprType::MemoryCopy:
    case ExprType::TableCopy:
      return { 3, 0 };

    case ExprType::AtomicLoad:
    case ExprType::Convert:
    case ExprType::Load:
    case ExprType::LocalTee:
    case ExprType::MemoryGrow:
    case ExprType::Unary:
    case ExprType::TableGet:
    case ExprType::RefIsNull:
      return { 1, 1 };

    case ExprType::Drop:
    case ExprType::GlobalSet:
    case ExprType::LocalSet:
      return { 1, 0 };

    case ExprType::If:
      return { 1, cast<IfExpr>(&expr)->true_.decl.sig.GetNumResults() };

    case ExprType::Loop:
      return { 0, cast<LoopExpr>(&expr)->block.decl.sig.GetNumResults() };

    case ExprType::Nop:
      return { 0, 0 };

    case ExprType::Return:
      return
        { static_cast<Index>(current_func_->decl.sig.result_types.size()), 1,
          true };

    case ExprType::Rethrow:
      return { 0, 0, true };

    case ExprType::AtomicRmwCmpxchg:
    case ExprType::AtomicWait:
    case ExprType::Select:
      return { 3, 1 };

    case ExprType::Throw: {
      auto throw_ = cast<ThrowExpr>(&expr);
      Index operand_count = 0;
      if (Event* event = module.GetEvent(throw_->var)) {
        operand_count = event->decl.sig.param_types.size();
      }
      return { operand_count, 0, true };
    }

    case ExprType::Try:
      return { 0, cast<TryExpr>(&expr)->block.decl.sig.GetNumResults() };
      break;

    case ExprType::Ternary:
      return { 3, 1 };

    case ExprType::SimdLaneOp: {
      const Opcode opcode = cast<SimdLaneOpExpr>(&expr)->opcode;
      switch (opcode) {
        case Opcode::I8X16ExtractLaneS:
        case Opcode::I8X16ExtractLaneU:
        case Opcode::I16X8ExtractLaneS:
        case Opcode::I16X8ExtractLaneU:
        case Opcode::I32X4ExtractLane:
        case Opcode::I64X2ExtractLane:
        case Opcode::F32X4ExtractLane:
        case Opcode::F64X2ExtractLane:
          return { 1, 1 };

        case Opcode::I8X16ReplaceLane:
        case Opcode::I16X8ReplaceLane:
        case Opcode::I32X4ReplaceLane:
        case Opcode::I64X2ReplaceLane:
        case Opcode::F32X4ReplaceLane:
        case Opcode::F64X2ReplaceLane:
          return { 2, 1 };

        default:
          fprintf(stderr, "Invalid Opcode for expr type: %s\n",
                  GetExprTypeName(expr));
          assert(0);
          return { 0, 0 };
      }
    }

    case ExprType::SimdShuffleOp:
      return { 2, 1 };

    default:
      fprintf(stderr, "bad expr type: %s\n", GetExprTypeName(expr));
      assert(0);
      return { 0, 0 };
  }
}